

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O2

void __thiscall
prometheus::anon_unknown_0::BasicAuthIntegrationTest_shouldPerformProperAuthentication_Test::
TestBody(BasicAuthIntegrationTest_shouldPerformProperAuthentication_Test *this)

{
  StringLike<std::__cxx11::basic_string<char>_> *substring;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matcher;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar1;
  AssertHelper local_c0;
  AssertionResult gtest_ar_1;
  _Any_data __tmp;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  Response metrics;
  
  __tmp._8_8_ = 0;
  metrics.code = *(long *)&(this->super_BasicAuthIntegrationTest).super_IntegrationTest.
                           fetchPrePerform_.super__Function_base._M_functor;
  metrics.body._M_dataplus._M_p =
       *(pointer *)
        ((long)&(this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.
                super__Function_base._M_functor + 8);
  *(BasicAuthIntegrationTest_shouldPerformProperAuthentication_Test **)
   &(this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.
    super__Function_base._M_functor = this;
  *(undefined8 *)
   ((long)&(this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.
           super__Function_base._M_functor + 8) = 0;
  metrics.body._M_string_length =
       (size_type)
       (this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.
       super__Function_base._M_manager;
  metrics.body.field_2._M_allocated_capacity =
       (size_type)
       (this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_._M_invoker;
  (this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.super__Function_base
  ._M_manager = std::
                _Function_handler<void_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc:227:22)>
                ::_M_manager;
  (this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_._M_invoker =
       std::
       _Function_handler<void_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc:227:22)>
       ::_M_invoke;
  __tmp._M_unused._M_object = this;
  std::_Function_base::~_Function_base((_Function_base *)&metrics);
  IntegrationTest::FetchMetrics
            (&metrics,(IntegrationTest *)this,
             &(this->super_BasicAuthIntegrationTest).super_IntegrationTest.default_metrics_path_);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)__tmp._M_pod_data,"metrics.code","200",&metrics.code,(int *)&gtest_ar_1);
  if (__tmp._M_pod_data[0] == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (__tmp._8_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)__tmp._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc"
               ,0xea,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&gtest_ar_1);
    this_00 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(__tmp._M_pod_data + 8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(__tmp._M_pod_data + 8));
    testing::HasSubstr<std::__cxx11::string>
              (&local_88,(testing *)&(this->super_BasicAuthIntegrationTest).counter_name_,substring)
    ;
    testing::internal::
    MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
              ((PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&__tmp,(internal *)&local_88,matcher);
    testing::internal::
    PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
    ::operator()(&gtest_ar_1,__tmp._M_pod_data,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1564c7);
    std::__cxx11::string::~string((string *)__tmp._M_pod_data);
    std::__cxx11::string::~string((string *)&local_88);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&__tmp);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc"
                 ,0xeb,pcVar1);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&__tmp);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if (__tmp._M_unused._M_object != (void *)0x0) {
        (**(code **)(*__tmp._M_unused._M_object + 8))();
      }
    }
    this_00 = &gtest_ar_1.message_;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
  IntegrationTest::Response::~Response(&metrics);
  return;
}

Assistant:

TEST_F(BasicAuthIntegrationTest, shouldPerformProperAuthentication) {
  fetchPrePerform_ = [&](CURL* curl) {
    curl_easy_setopt(curl, CURLOPT_HTTPAUTH, CURLAUTH_BASIC);
    curl_easy_setopt(curl, CURLOPT_USERNAME, username_.c_str());
    curl_easy_setopt(curl, CURLOPT_PASSWORD, password_.c_str());
  };

  const auto metrics = FetchMetrics(default_metrics_path_);
  ASSERT_EQ(metrics.code, 200);
  EXPECT_THAT(metrics.body, HasSubstr(counter_name_));
}